

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionResult::~AssertionResult(AssertionResult *this)

{
  AssertionInfo *in_RDI;
  
  AssertionResultData::~AssertionResultData((AssertionResultData *)in_RDI);
  AssertionInfo::~AssertionInfo(in_RDI);
  return;
}

Assistant:

AssertionResult::~AssertionResult() {}